

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O1

void sysbvm_dwarf_cfi_beginCIE(sysbvm_dwarf_cfi_builder_t *cfi,sysbvm_dwarf_cie_t *cie)

{
  size_t sVar1;
  bool bVar2;
  intptr_t iVar3;
  uintptr_t uVar4;
  undefined7 uVar5;
  char *newEntries;
  uintptr_t uVar6;
  int local_2c;
  
  local_2c = 0;
  sVar1 = (cfi->buffer).size;
  sysbvm_dynarray_addAll(&cfi->buffer,4,&local_2c);
  cfi->cieOffset = sVar1;
  local_2c = -(cfi->isEhFrame ^ 1);
  sVar1 = (cfi->buffer).size;
  sysbvm_dynarray_addAll(&cfi->buffer,4,&local_2c);
  cfi->cieContentOffset = sVar1;
  uVar5 = *(undefined7 *)&cie->field_0x1;
  uVar6 = cie->codeAlignmentFactor;
  iVar3 = cie->dataAlignmentFactor;
  uVar4 = cie->returnAddressRegister;
  (cfi->cie).pointerSize = cie->pointerSize;
  *(undefined7 *)&(cfi->cie).field_0x1 = uVar5;
  (cfi->cie).codeAlignmentFactor = uVar6;
  (cfi->cie).dataAlignmentFactor = iVar3;
  (cfi->cie).returnAddressRegister = uVar4;
  local_2c._0_1_ = cfi->version;
  sysbvm_dynarray_addAll(&cfi->buffer,1,&local_2c);
  newEntries = "";
  if (cfi->isEhFrame != false) {
    newEntries = "zR";
  }
  sysbvm_dynarray_addAll(&cfi->buffer,(ulong)cfi->isEhFrame * 2 + 1,newEntries);
  if (cfi->isEhFrame == false) {
    local_2c._0_1_ = 8;
    sysbvm_dynarray_addAll(&cfi->buffer,1,&local_2c);
    local_2c._0_1_ = 0;
    sysbvm_dynarray_addAll(&cfi->buffer,1,&local_2c);
  }
  uVar6 = cie->codeAlignmentFactor;
  do {
    local_2c._0_1_ = (0x7f < uVar6) << 7 | (byte)uVar6 & 0x7f;
    sysbvm_dynarray_add(&cfi->buffer,&local_2c);
    bVar2 = 0x7f < uVar6;
    uVar6 = uVar6 >> 7;
  } while (bVar2);
  sysbvm_dwarf_encodeSLEB128(&cfi->buffer,cie->dataAlignmentFactor);
  if ((cfi->version < 3) && (cfi->isEhFrame == false)) {
    local_2c._0_1_ = (byte)cie->returnAddressRegister;
    sysbvm_dynarray_addAll(&cfi->buffer,1,&local_2c);
  }
  else {
    uVar6 = cie->returnAddressRegister;
    do {
      local_2c._0_1_ = (0x7f < uVar6) << 7 | (byte)uVar6 & 0x7f;
      sysbvm_dynarray_add(&cfi->buffer,&local_2c);
      bVar2 = 0x7f < uVar6;
      uVar6 = uVar6 >> 7;
    } while (bVar2);
  }
  if (cfi->isEhFrame == true) {
    local_2c._0_1_ = 1;
    sysbvm_dynarray_add(&cfi->buffer,&local_2c);
    local_2c = CONCAT31(local_2c._1_3_,0x1b);
    sysbvm_dynarray_addAll(&cfi->buffer,1,&local_2c);
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_cfi_beginCIE(sysbvm_dwarf_cfi_builder_t *cfi, sysbvm_dwarf_cie_t *cie)
{
    cfi->cieOffset = sysbvm_dwarf_encodeDWord(&cfi->buffer, 0);
    cfi->cieContentOffset = sysbvm_dwarf_encodeDwarfPointer(&cfi->buffer, cfi->isEhFrame ? 0 : -1 ); // CIE_id
    cfi->cie = *cie;
    sysbvm_dwarf_encodeByte(&cfi->buffer, cfi->version);
    sysbvm_dwarf_encodeCString(&cfi->buffer, cfi->isEhFrame ? "zR" : ""); // Argumentation
    if(!cfi->isEhFrame)
    {
        sysbvm_dwarf_encodeByte(&cfi->buffer, sizeof(uintptr_t)); // Address size
        sysbvm_dwarf_encodeByte(&cfi->buffer, 0); // Segment size
    }
    sysbvm_dwarf_encodeULEB128(&cfi->buffer, cie->codeAlignmentFactor);
    sysbvm_dwarf_encodeSLEB128(&cfi->buffer, cie->dataAlignmentFactor);
    if(cfi->version <= 2 && !cfi->isEhFrame)
        sysbvm_dwarf_encodeByte(&cfi->buffer, (uint8_t)cie->returnAddressRegister);
    else
        sysbvm_dwarf_encodeULEB128(&cfi->buffer, cie->returnAddressRegister);
    if(cfi->isEhFrame)
    {
        sysbvm_dwarf_encodeULEB128(&cfi->buffer, 1);
        sysbvm_dwarf_encodeByte(&cfi->buffer, DW_EH_PE_pcrel | DW_EH_PE_sdata4);
    }
}